

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O3

void __thiscall
QtMWidgets::AbstractScrollAreaPrivate::calcIndicator
          (AbstractScrollAreaPrivate *this,Orientation orient,int minSize,int width,bool *needPaint,
          int *indicatorSize,QPoint *indicatorPos)

{
  QWidget *pQVar1;
  long lVar2;
  QWidget *pQVar3;
  undefined1 auVar4 [16];
  int iVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar17;
  undefined1 auVar16 [16];
  double dVar18;
  
  if (orient == Vertical) {
    pQVar1 = this->viewport;
    lVar2 = *(long *)(pQVar1 + 0x20);
    iVar9 = (*(int *)(lVar2 + 0x20) - *(int *)(lVar2 + 0x18)) + 1;
    iVar8 = (this->scrolledAreaSize).ht;
    uVar6 = (ulong)(uint)(width * 2);
    iVar5 = (*(int *)(lVar2 + 0x1c) - *(int *)(lVar2 + 0x14)) + 1;
    iVar7 = (this->scrolledAreaSize).wd;
    if (iVar7 <= iVar5) {
      iVar5 = iVar7;
    }
    pQVar3 = *(QWidget **)(*(long *)&this->vertIndicator->field_0x8 + 0x10);
    iVar7 = 0;
    if (pQVar3 != pQVar1) {
      iVar7 = (this->topLeftCorner).xp;
    }
    dVar11 = (double)iVar8;
    uVar10 = iVar5 + width * -2 + iVar7;
    if (iVar9 < iVar8) {
      iVar8 = iVar9;
    }
    iVar8 = iVar8 + width * -4;
    if ((double)iVar9 / dVar11 < 1.0) {
      dVar12 = (double)iVar8;
      iVar7 = (int)(((double)iVar9 / dVar11) * dVar12);
      auVar16._0_8_ = (double)iVar7;
      auVar16._8_8_ = (double)(this->topLeftCorner).yp;
      auVar15._8_8_ = dVar11;
      auVar15._0_8_ = (double)minSize;
      auVar15 = divpd(auVar16,auVar15);
      dVar17 = auVar15._8_8_;
      iVar8 = minSize;
      if (minSize < iVar7) {
        iVar8 = iVar7;
      }
      dVar13 = dVar17;
      if (iVar7 < minSize) {
        dVar13 = auVar15._0_8_ * dVar17;
      }
      dVar18 = 0.0;
      if (pQVar3 != pQVar1) {
        dVar18 = dVar11;
      }
      uVar6 = (ulong)(uint)(int)((double)(width * 2) + dVar12 * dVar13 + dVar18 * dVar17);
      goto LAB_00159e8f;
    }
  }
  else {
    if (orient != Horizontal) {
      return;
    }
    pQVar1 = this->viewport;
    lVar2 = *(long *)(pQVar1 + 0x20);
    iVar9 = (*(int *)(lVar2 + 0x1c) - *(int *)(lVar2 + 0x14)) + 1;
    iVar8 = (this->scrolledAreaSize).wd;
    uVar10 = width * 2;
    iVar5 = (*(int *)(lVar2 + 0x20) - *(int *)(lVar2 + 0x18)) + 1;
    iVar7 = (this->scrolledAreaSize).ht;
    if (iVar7 <= iVar5) {
      iVar5 = iVar7;
    }
    pQVar3 = *(QWidget **)(*(long *)&this->horIndicator->field_0x8 + 0x10);
    iVar7 = 0;
    if (pQVar3 != pQVar1) {
      iVar7 = (this->topLeftCorner).yp;
    }
    dVar11 = (double)iVar8;
    uVar6 = (ulong)(uint)(iVar5 + width * -2 + iVar7);
    if (iVar9 < iVar8) {
      iVar8 = iVar9;
    }
    iVar8 = iVar8 + width * -4;
    if ((double)iVar9 / dVar11 < 1.0) {
      dVar12 = (double)iVar8;
      iVar7 = (int)(((double)iVar9 / dVar11) * dVar12);
      auVar14._0_8_ = (double)iVar7;
      auVar14._8_8_ = (double)(this->topLeftCorner).xp;
      auVar4._8_8_ = dVar11;
      auVar4._0_8_ = (double)minSize;
      auVar15 = divpd(auVar14,auVar4);
      dVar17 = auVar15._8_8_;
      iVar8 = minSize;
      if (minSize < iVar7) {
        iVar8 = iVar7;
      }
      dVar13 = dVar17;
      if (iVar7 < minSize) {
        dVar13 = auVar15._0_8_ * dVar17;
      }
      dVar18 = 0.0;
      if (pQVar3 != pQVar1) {
        dVar18 = dVar11;
      }
      uVar10 = (uint)((double)(int)uVar10 + dVar12 * dVar13 + dVar18 * dVar17);
      goto LAB_00159e8f;
    }
  }
  *needPaint = false;
LAB_00159e8f:
  *indicatorSize = iVar8;
  *indicatorPos = (QPoint)((ulong)uVar10 | uVar6 << 0x20);
  return;
}

Assistant:

void
AbstractScrollAreaPrivate::calcIndicator( Qt::Orientation orient,
	int minSize, int width, bool & needPaint,
	int & indicatorSize, QPoint & indicatorPos )
{
	int viewportSize = 0;
	int scrolledSize = 0;
	int x = 0;
	int y = 0;
	double posRatio = 0.0;
	int totalIndicatorSize = 0;
	double ratio = 0.0;
	double deltaRatio = 0.0;

	switch( orient )
	{
		case Qt::Horizontal :
		{
			viewportSize = viewport->width();
			scrolledSize = scrolledAreaSize.width();
			x = 2 * width;
			y = qMin( viewport->height(), scrolledAreaSize.height() ) - x;
			y += ( horIndicator->parent() == viewport ? 0 : topLeftCorner.y() );
			posRatio = (double) topLeftCorner.x() / (double) scrolledSize;
			totalIndicatorSize = qMin( viewportSize, scrolledSize ) - 4 * width;
			ratio = (double) viewportSize / (double) scrolledSize;
			deltaRatio = posRatio;

			if( ratio < 1.0 )
			{
				indicatorSize = (double) totalIndicatorSize * ratio;

				if( indicatorSize < minSize )
				{
					deltaRatio *= ( (double) indicatorSize / (double) minSize );
					indicatorSize = minSize;
				}

				x += totalIndicatorSize * deltaRatio
					+ ( horIndicator->parent() == viewport ? 0 : scrolledSize )
					* posRatio;
			}
			else
			{
				needPaint = false;
				indicatorSize = totalIndicatorSize;
			}

			indicatorPos = QPoint( x, y );
		}
		break;

		case Qt::Vertical :
		{
			viewportSize = viewport->height();
			scrolledSize = scrolledAreaSize.height();
			y = 2 * width;
			x = qMin( viewport->width(), scrolledAreaSize.width() ) - y;
			x += ( vertIndicator->parent() == viewport ? 0 : topLeftCorner.x() );
			posRatio = (double) topLeftCorner.y() / (double) scrolledSize;
			totalIndicatorSize = qMin( viewportSize, scrolledSize ) - 4 * width;
			ratio = (double) viewportSize / (double) scrolledSize;
			deltaRatio = posRatio;

			if( ratio < 1.0 )
			{
				indicatorSize = (double) totalIndicatorSize * ratio;

				if( indicatorSize < minSize )
				{
					deltaRatio *= ( (double) indicatorSize / (double) minSize );
					indicatorSize = minSize;
				}

				y += totalIndicatorSize * deltaRatio
					+ ( vertIndicator->parent() == viewport ? 0 : scrolledSize )
					* posRatio;
			}
			else
			{
				needPaint = false;
				indicatorSize = totalIndicatorSize;
			}

			indicatorPos = QPoint( x, y );
		}
		break;
	}
}